

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression_suite.cpp
# Opt level: O0

void anscombe_quartet::anscombe_IV(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  double absolute_tolerance;
  double *in_stack_fffffffffffffe28;
  double local_1c0;
  value_type local_1b8;
  value_type local_1b0;
  double local_1a0;
  value_type local_198;
  undefined1 local_190 [8];
  regression<double,_12UL> filter;
  close_to<double> tolerance;
  
  absolute_tolerance = std::numeric_limits<double>::min();
  trial::online::detail::close_to<double>::close_to
            ((close_to<double> *)&filter.x_moment.sum,0.05,absolute_tolerance);
  trial::online::window::regression<double,_12UL>::regression((regression<double,_12UL> *)local_190)
  ;
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,6.58);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,5.76);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,7.71);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,8.84);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,8.47);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,7.04);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,5.25);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,19.0,12.5);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,5.56);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,7.91);
  trial::online::window::regression<double,_12UL>::push
            ((regression<double,_12UL> *)local_190,8.0,6.89);
  local_198 = trial::online::window::regression<double,_12UL>::slope
                        ((regression<double,_12UL> *)local_190);
  local_1a0 = 0.5;
  local_1b0 = filter.x_moment.sum.variance;
  predicate_00.absolute = tolerance.relative;
  predicate_00.relative = filter.x_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.slope()","0.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/regression_suite.cpp"
             ,(char *)0x107,0x10c5a6,(char *)&local_198,&local_1a0,in_stack_fffffffffffffe28,
             predicate_00);
  local_1b8 = trial::online::window::regression<double,_12UL>::at
                        ((regression<double,_12UL> *)local_190,0.0);
  local_1c0 = 3.0;
  predicate.absolute = tolerance.relative;
  predicate.relative = filter.x_moment.sum.variance;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.at(0)","3.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/regression_suite.cpp"
             ,(char *)0x108,0x10c5a6,(char *)&local_1b8,&local_1c0,in_stack_fffffffffffffe28,
             predicate);
  return;
}

Assistant:

void anscombe_IV()
{
    const auto tolerance = detail::close_to<double>(5e-2);
    window::regression<double, 12> filter;

    filter.push(8.0, 6.58);
    filter.push(8.0, 5.76);
    filter.push(8.0, 7.71);
    filter.push(8.0, 8.84);
    filter.push(8.0, 8.47);
    filter.push(8.0, 7.04);
    filter.push(8.0, 5.25);
    filter.push(19.0, 12.50);
    filter.push(8.0, 5.56);
    filter.push(8.0, 7.91);
    filter.push(8.0, 6.89);
    TRIAL_TEST_WITH(filter.slope(), 0.5, tolerance);
    TRIAL_TEST_WITH(filter.at(0), 3.0, tolerance);
}